

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamSequenceDictionary.cpp
# Opt level: O0

void __thiscall
BamTools::SamSequenceDictionary::Remove(SamSequenceDictionary *this,string *sequenceName)

{
  bool bVar1;
  mapped_type_conflict *pmVar2;
  key_type *pkVar3;
  SamSequenceIterator this_00;
  __normal_iterator<BamTools::SamSequence_*,_std::vector<BamTools::SamSequence,_std::allocator<BamTools::SamSequence>_>_>
  this_01;
  iterator this_02;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_RSI;
  SamSequenceDictionary *in_RDI;
  SamSequence *sq;
  size_t i;
  size_t numEntries;
  size_t indexToRemove;
  vector<BamTools::SamSequence,_std::allocator<BamTools::SamSequence>_> *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  SamSequenceDictionary *in_stack_ffffffffffffffc0;
  const_iterator in_stack_ffffffffffffffc8;
  key_type *local_28;
  key_type *in_stack_ffffffffffffffe8;
  key_type *__k;
  
  bVar1 = IsEmpty((SamSequenceDictionary *)0x194cec);
  if ((!bVar1) && (bVar1 = Contains(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8), bVar1)) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[](in_RSI,in_stack_ffffffffffffffe8);
    __k = (key_type *)*pmVar2;
    pkVar3 = (key_type *)
             std::vector<BamTools::SamSequence,_std::allocator<BamTools::SamSequence>_>::size
                       (&in_RDI->m_data);
    local_28 = __k;
    while (local_28 = (key_type *)((long)&local_28->Type + 1), local_28 < pkVar3) {
      std::vector<BamTools::SamSequence,_std::allocator<BamTools::SamSequence>_>::at
                (in_stack_ffffffffffffffb0,(size_type)in_RDI);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ::operator[](in_RSI,__k);
      *pmVar2 = *pmVar2 - 1;
    }
    this_00 = Begin(in_RDI);
    this_01 = __gnu_cxx::
              __normal_iterator<BamTools::SamSequence_*,_std::vector<BamTools::SamSequence,_std::allocator<BamTools::SamSequence>_>_>
              ::operator+(this_00._M_current,(difference_type)in_stack_ffffffffffffffb0);
    __gnu_cxx::
    __normal_iterator<BamTools::SamSequence_const*,std::vector<BamTools::SamSequence,std::allocator<BamTools::SamSequence>>>
    ::__normal_iterator<BamTools::SamSequence*>
              ((__normal_iterator<const_BamTools::SamSequence_*,_std::vector<BamTools::SamSequence,_std::allocator<BamTools::SamSequence>_>_>
                *)in_stack_ffffffffffffffb0,
               (__normal_iterator<BamTools::SamSequence_*,_std::vector<BamTools::SamSequence,_std::allocator<BamTools::SamSequence>_>_>
                *)in_RDI);
    this_02 = std::vector<BamTools::SamSequence,_std::allocator<BamTools::SamSequence>_>::erase
                        (this_01._M_current,in_stack_ffffffffffffffc8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::erase((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             *)this_02._M_current,(key_type *)in_RDI);
  }
  return;
}

Assistant:

void SamSequenceDictionary::Remove(const std::string& sequenceName)
{

    // skip if empty dictionary or if name unknown
    if (IsEmpty() || !Contains(sequenceName)) {
        return;
    }

    // update 'lookup index' for every entry after @sequenceName
    const std::size_t indexToRemove = m_lookupData[sequenceName];
    const std::size_t numEntries = m_data.size();
    for (std::size_t i = indexToRemove + 1; i < numEntries; ++i) {
        const SamSequence& sq = m_data.at(i);
        --m_lookupData[sq.Name];
    }

    // erase entry from containers
    m_data.erase(Begin() + indexToRemove);
    m_lookupData.erase(sequenceName);
}